

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SimpleParallelAnalyzerResults::GenerateExportFile
          (SimpleParallelAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  uchar *puVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  ulonglong uVar5;
  ostream *poVar6;
  ulong uVar7;
  uint uVar8;
  uchar *local_320;
  undefined8 local_318;
  uchar local_310 [16];
  string local_300 [8];
  uint local_2f8;
  Frame frame;
  ulonglong local_2d0;
  char number_str [128];
  char time_str [128];
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pvVar4 = (void *)AnalyzerHelpers::StartFile(file,false);
  uVar5 = Analyzer::GetTriggerSample();
  uVar3 = Analyzer::GetSampleRate();
  poVar6 = std::operator<<(local_1a8,"Time [s],Value");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar7 = AnalyzerResults::GetNumFrames();
  uVar8 = 0;
  do {
    if (uVar7 <= uVar8) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
      AnalyzerHelpers::EndFile(pvVar4);
LAB_00106e0f:
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&frame);
    AnalyzerHelpers::GetTimeString(_frame,uVar5,uVar3,time_str,0x80);
    AnalyzerHelpers::GetNumberString(local_2d0,display_base,0x10,number_str,0x80);
    poVar6 = std::operator<<(local_1a8,time_str);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = std::operator<<(poVar6,number_str);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::stringbuf::str();
    puVar1 = local_320;
    std::__cxx11::stringbuf::str();
    AnalyzerHelpers::AppendToFile(puVar1,local_2f8,pvVar4);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string((string *)&local_320);
    local_320 = local_310;
    local_318 = 0;
    local_310[0] = '\0';
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)&local_320);
    cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar8);
    if (cVar2 != '\0') {
      AnalyzerHelpers::EndFile(pvVar4);
      Frame::~Frame(&frame);
      goto LAB_00106e0f;
    }
    Frame::~Frame(&frame);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void SimpleParallelAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
	std::stringstream ss;
	void* f = AnalyzerHelpers::StartFile( file );

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	ss << "Time [s],Value" << std::endl;

	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );
		
		char time_str[128];
		AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

		char number_str[128];
		AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );

		ss << time_str << "," << number_str << std::endl;

		AnalyzerHelpers::AppendToFile( (U8*)ss.str().c_str(), (U32)ss.str().length(), f );
		ss.str( std::string() );
							
		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			AnalyzerHelpers::EndFile( f );
			return;
		}
	}

	UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
	AnalyzerHelpers::EndFile( f );
}